

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# archive_read_disk_posix.c
# Opt level: O3

wchar_t archive_read_disk_set_behavior(archive *_a,wchar_t flags)

{
  _func_int_archive_ptr_archive_entry_ptr_ptr **pp_Var1;
  int iVar2;
  wchar_t wVar3;
  
  iVar2 = __archive_check_magic(_a,0xbadb0c5,0x7fff,"archive_read_disk_honor_nodump");
  wVar3 = L'\xffffffe2';
  if (iVar2 != -0x1e) {
    if ((flags & 1U) == 0) {
      *(undefined4 *)&_a[1].compression_name = 0;
      wVar3 = L'\0';
      if (_a[1].vtable != (archive_vtable_conflict *)0x0) {
        pp_Var1 = &(_a[1].vtable)->archive_read_next_header;
        *(byte *)pp_Var1 = *(byte *)pp_Var1 & 0x7f;
        wVar3 = L'\0';
      }
    }
    else {
      wVar3 = archive_read_disk_set_atime_restored(_a);
    }
    *(uint *)((long)&_a[1].compression_name + 4) = (uint)flags >> 1 & 1;
    _a[1].file_count = (uint)flags >> 2 & 1;
    _a[1].archive_error_number = (uint)((flags & 8U) == 0);
  }
  return wVar3;
}

Assistant:

int
archive_read_disk_set_behavior(struct archive *_a, int flags)
{
	struct archive_read_disk *a = (struct archive_read_disk *)_a;
	int r = ARCHIVE_OK;

	archive_check_magic(_a, ARCHIVE_READ_DISK_MAGIC,
	    ARCHIVE_STATE_ANY, "archive_read_disk_honor_nodump");

	if (flags & ARCHIVE_READDISK_RESTORE_ATIME)
		r = archive_read_disk_set_atime_restored(_a);
	else {
		a->restore_time = 0;
		if (a->tree != NULL)
			a->tree->flags &= ~needsRestoreTimes;
	}
	if (flags & ARCHIVE_READDISK_HONOR_NODUMP)
		a->honor_nodump = 1;
	else
		a->honor_nodump = 0;
	if (flags & ARCHIVE_READDISK_MAC_COPYFILE)
		a->enable_copyfile = 1;
	else
		a->enable_copyfile = 0;
	if (flags & ARCHIVE_READDISK_NO_TRAVERSE_MOUNTS)
		a->traverse_mount_points = 0;
	else
		a->traverse_mount_points = 1;
	return (r);
}